

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O1

void __thiscall
YAML::NodeBuilder::OnSequenceStart
          (NodeBuilder *this,Mark *mark,string *tag,anchor_t anchor,value style)

{
  node *this_00;
  
  this_00 = Push(this,mark,anchor);
  detail::node::mark_defined(this_00);
  detail::node_data::set_tag
            ((((this_00->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,tag);
  detail::node::mark_defined(this_00);
  detail::node_data::set_type
            ((((this_00->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,Sequence);
  detail::node::mark_defined(this_00);
  detail::node_data::set_style
            ((((this_00->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,style);
  return;
}

Assistant:

void NodeBuilder::OnSequenceStart(const Mark& mark, const std::string& tag,
                                  anchor_t anchor, EmitterStyle::value style) {
  detail::node& node = Push(mark, anchor);
  node.set_tag(tag);
  node.set_type(NodeType::Sequence);
  node.set_style(style);
}